

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimage_conversions.cpp
# Opt level: O0

void convert_RGBA64_to_ARGB32<true>(QImageData *dest,QImageData *src,ImageConversionFlags param_3)

{
  long in_RSI;
  QRgba64 *s;
  uint *d;
  int i;
  uchar *destData;
  uchar *srcData;
  undefined4 local_2c;
  
  for (local_2c = 0; local_2c < *(int *)(in_RSI + 8); local_2c = local_2c + 1) {
    qt_convertRGBA64ToARGB32<true>((uint *)src,(QRgba64 *)srcData,destData._4_4_);
  }
  return;
}

Assistant:

static void convert_RGBA64_to_ARGB32(QImageData *dest, const QImageData *src, Qt::ImageConversionFlags)
{
    Q_ASSERT(src->format == QImage::Format_RGBA64);
    Q_ASSERT(RGBA || dest->format == QImage::Format_ARGB32);
    Q_ASSERT(!RGBA || dest->format == QImage::Format_RGBA8888);
    Q_ASSERT(src->width == dest->width);
    Q_ASSERT(src->height == dest->height);

    const uchar *srcData = src->data;
    uchar *destData = dest->data;

    for (int i = 0; i < src->height; ++i) {
        uint *d = reinterpret_cast<uint *>(destData);
        const QRgba64 *s = reinterpret_cast<const QRgba64 *>(srcData);
        qt_convertRGBA64ToARGB32<RGBA>(d, s, src->width);
        srcData += src->bytes_per_line;
        destData += dest->bytes_per_line;
    }
}